

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
DecodeBase64(optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *__return_storage_ptr__,string_view str)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uchar local_39;
  long local_38;
  
  pbVar5 = (byte *)str._M_str;
  sVar2 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])str & (undefined1  [16])0x3) != (undefined1  [16])0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = false;
    goto LAB_001373f9;
  }
  if (sVar2 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = sVar2 - (pbVar5[sVar2 - 1] == 0x3d);
    lVar6 = lVar6 - (ulong)(pbVar5[lVar6 + -1] == 0x3d);
  }
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&local_58,(ulong)(lVar6 * 3) >> 2);
  if (lVar6 == 0) {
    uVar1 = 0;
    uVar4 = 0;
LAB_001373b0:
    if ((uVar1 << (8U - (char)uVar4 & 0x3f) & 0xfe) == 0) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10) =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged = true;
      goto LAB_001373f9;
    }
  }
  else {
    pbVar7 = pbVar5 + lVar6;
    uVar1 = 0;
    uVar3 = 0;
    do {
      if ((long)DecodeBase64::decode64_table[*pbVar5] < 0) goto LAB_001373bd;
      uVar1 = (ulong)(((uint)uVar1 & 0x7f) << 6) | (long)DecodeBase64::decode64_table[*pbVar5];
      uVar4 = uVar3 + 6;
      if (1 < uVar3) {
        do {
          uVar4 = uVar4 - 8;
          local_39 = (uchar)(uVar1 >> ((byte)uVar4 & 0x3f));
          if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_39);
          }
          else {
            *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_39;
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        } while (7 < uVar4);
      }
      pbVar5 = pbVar5 + 1;
      uVar3 = uVar4;
    } while (pbVar5 != pbVar7);
    if (uVar4 < 6) goto LAB_001373b0;
  }
LAB_001373bd:
  (__return_storage_ptr__->
  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
  _M_engaged = false;
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_001373f9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<unsigned char>> DecodeBase64(std::string_view str)
{
    static const int8_t decode64_table[256]{
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, 62, -1, -1, -1, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60, 61, -1, -1,
        -1, -1, -1, -1, -1,  0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1, -1, -1, 26, 27, 28,
        29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48,
        49, 50, 51, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1
    };

    if (str.size() % 4 != 0) return {};
    /* One or two = characters at the end are permitted. */
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);

    std::vector<unsigned char> ret;
    ret.reserve((str.size() * 3) / 4);
    bool valid = ConvertBits<6, 8, false>(
        [&](unsigned char c) { ret.push_back(c); },
        str.begin(), str.end(),
        [](char c) { return decode64_table[uint8_t(c)]; }
    );
    if (!valid) return {};

    return ret;
}